

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SGXMLScanner::scanReset(SGXMLScanner *this,InputSource *src)

{
  XMLValidator *pXVar1;
  MemoryManager *pMVar2;
  XMLStringPool *pXVar3;
  uint uVar4;
  int iVar5;
  PSVIHandler *pPVar6;
  XSModel *pXVar7;
  SchemaGrammar *this_00;
  PSVIElement *this_01;
  ValueStackOf<bool> *this_02;
  XMLReader *reader;
  undefined4 extraout_var;
  RuntimeException *pRVar8;
  undefined4 extraout_var_00;
  XMLSize_t XVar9;
  XMLReader *newReader;
  InputSource *src_local;
  SGXMLScanner *this_local;
  
  GrammarResolver::cacheGrammarFromParse
            ((this->super_XMLScanner).fGrammarResolver,
             (bool)((this->super_XMLScanner).fToCacheGrammar & 1));
  GrammarResolver::useCachedGrammarInParse
            ((this->super_XMLScanner).fGrammarResolver,
             (bool)((this->super_XMLScanner).fUseCachedGrammar & 1));
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::removeAll
            (this->fSchemaInfoList);
  if (this->fModel != (XSModel *)0x0) {
    pPVar6 = XMLScanner::getPSVIHandler(&this->super_XMLScanner);
    if (pPVar6 != (PSVIHandler *)0x0) {
      pXVar7 = GrammarResolver::getXSModel((this->super_XMLScanner).fGrammarResolver);
      this->fModel = pXVar7;
    }
  }
  if (this->fSchemaGrammar == (SchemaGrammar *)0x0) {
    this_00 = (SchemaGrammar *)
              XMemory::operator_new(0x98,(this->super_XMLScanner).fGrammarPoolMemoryManager);
    SchemaGrammar::SchemaGrammar(this_00,(this->super_XMLScanner).fGrammarPoolMemoryManager);
    this->fSchemaGrammar = this_00;
  }
  (this->super_XMLScanner).fGrammar = &this->fSchemaGrammar->super_Grammar;
  this->fGrammarType = DTDGrammarType;
  (this->super_XMLScanner).fRootGrammar = (Grammar *)0x0;
  pXVar1 = (this->super_XMLScanner).fValidator;
  (*pXVar1->_vptr_XMLValidator[0xb])(pXVar1,(this->super_XMLScanner).fGrammar);
  if (((this->super_XMLScanner).fValidatorFromUser & 1U) != 0) {
    SchemaValidator::setErrorReporter
              ((SchemaValidator *)(this->super_XMLScanner).fValidator,
               (this->super_XMLScanner).fErrorReporter);
    SchemaValidator::setGrammarResolver
              ((SchemaValidator *)(this->super_XMLScanner).fValidator,
               (this->super_XMLScanner).fGrammarResolver);
    SchemaValidator::setExitOnFirstFatal
              ((SchemaValidator *)(this->super_XMLScanner).fValidator,
               (bool)((this->super_XMLScanner).fExitOnFirstFatal & 1));
  }
  (this->super_XMLScanner).fValidate =
       (bool)(-((this->super_XMLScanner).fValScheme == Val_Always) & 1);
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    (*((this->super_XMLScanner).fDocHandler)->_vptr_XMLDocumentHandler[9])();
  }
  if ((this->super_XMLScanner).fEntityHandler != (XMLEntityHandler *)0x0) {
    (*((this->super_XMLScanner).fEntityHandler)->_vptr_XMLEntityHandler[4])();
  }
  if ((this->super_XMLScanner).fErrorReporter != (XMLErrorReporter *)0x0) {
    (*((this->super_XMLScanner).fErrorReporter)->_vptr_XMLErrorReporter[3])();
  }
  XMLScanner::resetValidationContext(&this->super_XMLScanner);
  pMVar2 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar2->_vptr_MemoryManager[4])(pMVar2,(this->super_XMLScanner).fRootElemName);
  (this->super_XMLScanner).fRootElemName = (XMLCh *)0x0;
  if (this->fICHandler != (IdentityConstraintHandler *)0x0) {
    IdentityConstraintHandler::reset(this->fICHandler);
  }
  ElemStack::reset(&(this->super_XMLScanner).fElemStack,(this->super_XMLScanner).fEmptyNamespaceId,
                   (this->super_XMLScanner).fUnknownNamespaceId,
                   (this->super_XMLScanner).fXMLNamespaceId,
                   (this->super_XMLScanner).fXMLNSNamespaceId);
  if ((this->super_XMLScanner).fSchemaNamespaceId == 0) {
    pXVar3 = (this->super_XMLScanner).fURIStringPool;
    uVar4 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,SchemaSymbols::fgURI_XSI)
    ;
    (this->super_XMLScanner).fSchemaNamespaceId = uVar4;
  }
  (this->super_XMLScanner).fInException = false;
  (this->super_XMLScanner).fStandalone = false;
  (this->super_XMLScanner).fErrorCount = 0;
  (this->super_XMLScanner).fHasNoDTD = true;
  this->fSeeXsi = false;
  (this->super_XMLScanner).fDoNamespaces = true;
  (this->super_XMLScanner).fDoSchema = true;
  if (this->fPSVIElement == (PSVIElement *)0x0) {
    this_01 = (PSVIElement *)XMemory::operator_new(0x68,(this->super_XMLScanner).fMemoryManager);
    PSVIElement::PSVIElement(this_01,(this->super_XMLScanner).fMemoryManager);
    this->fPSVIElement = this_01;
  }
  if (this->fErrorStack == (ValueStackOf<bool> *)0x0) {
    this_02 = (ValueStackOf<bool> *)
              XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
    ValueStackOf<bool>::ValueStackOf(this_02,8,(this->super_XMLScanner).fMemoryManager,false);
    this->fErrorStack = this_02;
  }
  else {
    ValueStackOf<bool>::removeAllElements(this->fErrorStack);
  }
  resetPSVIElemContext(this);
  (*(this->fSchemaValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  SchemaValidator::setErrorReporter(this->fSchemaValidator,(this->super_XMLScanner).fErrorReporter);
  SchemaValidator::setExitOnFirstFatal
            (this->fSchemaValidator,(bool)((this->super_XMLScanner).fExitOnFirstFatal & 1));
  SchemaValidator::setGrammarResolver
            (this->fSchemaValidator,(this->super_XMLScanner).fGrammarResolver);
  if (((this->super_XMLScanner).fValidatorFromUser & 1U) != 0) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  reader = ReaderMgr::createReader
                     (&(this->super_XMLScanner).fReaderMgr,src,true,RefFrom_NonLiteral,Type_General,
                      Source_External,(bool)((this->super_XMLScanner).fCalculateSrcOfs & 1),
                      (this->super_XMLScanner).fLowWaterMark);
  if (reader == (XMLReader *)0x0) {
    uVar4 = (*src->_vptr_InputSource[6])();
    if ((uVar4 & 1) == 0) {
      pRVar8 = (RuntimeException *)__cxa_allocate_exception(0x30);
      iVar5 = (*src->_vptr_InputSource[5])();
      RuntimeException::RuntimeException
                (pRVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                 ,0xc68,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_00,iVar5),
                 (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(pRVar8,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    pRVar8 = (RuntimeException *)__cxa_allocate_exception(0x30);
    iVar5 = (*src->_vptr_InputSource[5])();
    RuntimeException::RuntimeException
              (pRVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
               ,0xc66,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var,iVar5),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(pRVar8,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  ReaderMgr::pushReader(&(this->super_XMLScanner).fReaderMgr,reader,(XMLEntityDecl *)0x0);
  if ((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) {
    XVar9 = (**(code **)(*(long *)(this->super_XMLScanner).fSecurityManager + 0x18))();
    (this->super_XMLScanner).fEntityExpansionLimit = XVar9;
    (this->super_XMLScanner).fEntityExpansionCount = 0;
  }
  this->fElemCount = 0;
  if ((this->super_XMLScanner).fUIntPoolRowTotal < 0x20) {
    XMLScanner::resetUIntPool(&this->super_XMLScanner);
  }
  else {
    RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeAll(this->fAttDefRegistry);
    XMLScanner::recreateUIntPool(&this->super_XMLScanner);
  }
  Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
  return;
}

Assistant:

void SGXMLScanner::scanReset(const InputSource& src)
{

    //  This call implicitly tells us that we are going to reuse the scanner
    //  if it was previously used. So tell the validator to reset itself.
    //
    //  But, if the fUseCacheGrammar flag is set, then don't reset it.
    //
    //  NOTE:   The ReaderMgr is flushed on the way out, because that is
    //          required to insure that files are closed.
    fGrammarResolver->cacheGrammarFromParse(fToCacheGrammar);
    fGrammarResolver->useCachedGrammarInParse(fUseCachedGrammar);

    // Clear transient schema info list.
    //
    fSchemaInfoList->removeAll ();

    // fModel may need updating, as fGrammarResolver could have cleaned it
    if(fModel && getPSVIHandler())
        fModel = fGrammarResolver->getXSModel();

    // Create dummy schema grammar
    if (!fSchemaGrammar) {
        fSchemaGrammar = new (fGrammarPoolMemoryManager) SchemaGrammar(fGrammarPoolMemoryManager);
    }

    fGrammar = fSchemaGrammar;
    fGrammarType = Grammar::DTDGrammarType;
    fRootGrammar = 0;

    fValidator->setGrammar(fGrammar);
    if (fValidatorFromUser) {

        ((SchemaValidator*) fValidator)->setErrorReporter(fErrorReporter);
        ((SchemaValidator*) fValidator)->setGrammarResolver(fGrammarResolver);
        ((SchemaValidator*) fValidator)->setExitOnFirstFatal(fExitOnFirstFatal);
    }

    // Reset validation
    fValidate = (fValScheme == Val_Always) ? true : false;

    //  And for all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    // Clear out the id reference list
    resetValidationContext();

    // Reset the Root Element Name
    fMemoryManager->deallocate(fRootElemName);//delete [] fRootElemName;
    fRootElemName = 0;

    // Reset IdentityConstraints
    if (fICHandler)
        fICHandler->reset();

    //  Reset the element stack, and give it the latest ids for the special
    //  URIs it has to know about.
    fElemStack.reset
    (
        fEmptyNamespaceId
        , fUnknownNamespaceId
        , fXMLNamespaceId
        , fXMLNSNamespaceId
    );

    if (!fSchemaNamespaceId)
        fSchemaNamespaceId  = fURIStringPool->addOrFind(SchemaSymbols::fgURI_XSI);

    // Reset some status flags
    fInException = false;
    fStandalone = false;
    fErrorCount = 0;
    fHasNoDTD = true;
    fSeeXsi = false;
    fDoNamespaces = true;
    fDoSchema = true;

    // Reset PSVI context
    // Note that we always need this around for DOMTypeInfo
    if (!fPSVIElement)
        fPSVIElement = new (fMemoryManager) PSVIElement(fMemoryManager);

    if (!fErrorStack)
    {
        fErrorStack = new (fMemoryManager) ValueStackOf<bool>(8, fMemoryManager);
    }
    else
    {
        fErrorStack->removeAllElements();
    }

    resetPSVIElemContext();

    // Reset the validators
    fSchemaValidator->reset();
    fSchemaValidator->setErrorReporter(fErrorReporter);
    fSchemaValidator->setExitOnFirstFatal(fExitOnFirstFatal);
    fSchemaValidator->setGrammarResolver(fGrammarResolver);
    if (fValidatorFromUser)
        fValidator->reset();

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , true
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );

    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    // Push this read onto the reader manager
    fReaderMgr.pushReader(newReader, 0);

    // and reset security-related things if necessary:
    if(fSecurityManager != 0)
    {
        fEntityExpansionLimit = fSecurityManager->getEntityExpansionLimit();
        fEntityExpansionCount = 0;
    }
    fElemCount = 0;
    if(fUIntPoolRowTotal >= 32)
    { // 8 KB tied up with validating attributes...
        fAttDefRegistry->removeAll();
        recreateUIntPool();
    }
    else
    {
        // note that this will implicitly reset the values of the hashtables,
        // though their buckets will still be tied up
        resetUIntPool();
    }
    fUndeclaredAttrRegistry->removeAll();
}